

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# includes.hpp
# Opt level: O3

double cvs_rk::HK<cvs_rk::mod_int<9223372036854775783ul>>
                 (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  *S)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *in_RDX;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 in_XMM6 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> m_k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  undefined1 auVar12 [64];
  
  get_counts_mk<cvs_rk::mod_int<9223372036854775783ul>>(&local_30,(cvs_rk *)S,in_RDX);
  if ((long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar18 = 0.0;
    if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return 0.0;
    }
  }
  else {
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar10 = vpbroadcastq_avx512f(ZEXT816(8));
    lVar6 = (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    auVar11 = vpbroadcastq_avx512f();
    uVar5 = 0;
    auVar12 = ZEXT1664(ZEXT816(0));
    do {
      auVar17 = auVar12;
      uVar4 = vpcmpuq_avx512f(auVar9,auVar11,2);
      auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_30.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar5));
      auVar13._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar12._8_8_;
      auVar13._0_8_ = (ulong)((byte)uVar4 & 1) * auVar12._0_8_;
      auVar13._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar12._16_8_;
      auVar13._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar12._24_8_;
      auVar13._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar12._32_8_;
      auVar13._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar12._40_8_;
      auVar13._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar12._48_8_;
      auVar13._56_8_ = (uVar4 >> 7) * auVar12._56_8_;
      uVar5 = uVar5 + 8;
      auVar12 = vpmullq_avx512dq(auVar13,auVar9);
      auVar9 = vpaddq_avx512f(auVar9,auVar10);
      auVar12 = vcvtuqq2pd_avx512dq(auVar12);
      auVar12 = vaddpd_avx512f(auVar17,auVar12);
    } while ((lVar6 + (ulong)(lVar6 == 0) + 7 & 0xfffffffffffffff8) != uVar5);
    if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      dVar18 = 0.0;
    }
    else {
      bVar2 = (bool)((byte)uVar4 & 1);
      auVar9._0_8_ = (ulong)bVar2 * auVar12._0_8_ | (ulong)!bVar2 * auVar17._0_8_;
      bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar9._8_8_ = (ulong)bVar2 * auVar12._8_8_ | (ulong)!bVar2 * auVar17._8_8_;
      bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar9._16_8_ = (ulong)bVar2 * auVar12._16_8_ | (ulong)!bVar2 * auVar17._16_8_;
      bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar9._24_8_ = (ulong)bVar2 * auVar12._24_8_ | (ulong)!bVar2 * auVar17._24_8_;
      bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar9._32_8_ = (ulong)bVar2 * auVar12._32_8_ | (ulong)!bVar2 * auVar17._32_8_;
      bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar9._40_8_ = (ulong)bVar2 * auVar12._40_8_ | (ulong)!bVar2 * auVar17._40_8_;
      bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar9._48_8_ = (ulong)bVar2 * auVar12._48_8_ | (ulong)!bVar2 * auVar17._48_8_;
      auVar9._56_8_ = (uVar4 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar17._56_8_;
      auVar8 = vextractf64x4_avx512f(auVar9,1);
      lVar7 = 0;
      auVar12 = vaddpd_avx512f(auVar9,ZEXT3264(auVar8));
      dVar14 = 1.0 / (auVar12._0_8_ + auVar12._16_8_ + auVar12._8_8_ + auVar12._24_8_);
      dVar18 = 0.0;
      do {
        if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7] != 0) {
          auVar3 = vcvtusi2sd_avx512f(in_XMM6,local_30.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar7] *
                                              lVar7);
          dVar15 = log(auVar3._0_8_ * dVar14);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar18;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = dVar14;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar15 * auVar3._0_8_;
          auVar1 = vfnmadd231sd_fma(auVar19,auVar16,auVar1);
          dVar18 = auVar1._0_8_;
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
  }
  operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return dVar18;
}

Assistant:

double HK(vector<T> S){

	auto m_k = get_counts_mk<T>(S);

	double Hk = 0;
	double M = 0;

	for(ulint k=0;k<m_k.size();++k){

		M += k*m_k[k];

	}

	for(ulint k=0;k<m_k.size();++k){

		if(m_k[k]>0) Hk -= (double(k*m_k[k])/M) * log(double(k*m_k[k])/M);

	}

	return Hk;

}